

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystemUtils.h
# Opt level: O2

Path * FileSystemUtils::operator/(Path *__return_storage_ptr__,Path *lhs_,Path *rhs_)

{
  ulong uVar1;
  Path *pPVar2;
  string strlhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pPVar2 = rhs_;
  if (((lhs_->m_string)._M_string_length == 0) ||
     (pPVar2 = lhs_, (rhs_->m_string)._M_string_length == 0)) {
    Path::Path(__return_storage_ptr__,pPVar2);
  }
  else {
    std::__cxx11::string::string((string *)&strlhs,(string *)&lhs_->m_string);
    while ((strlhs._M_string_length != 0 &&
           (uVar1 = std::__cxx11::string::find_last_of((char *)&strlhs,0x1150b3),
           uVar1 == strlhs._M_string_length - 1))) {
      std::__cxx11::string::erase((ulong)&strlhs,uVar1);
    }
    std::operator+(&local_70,&strlhs,'/');
    std::operator+(&local_50,&local_70,&rhs_->m_string);
    Path::Path(__return_storage_ptr__,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&strlhs);
  }
  return __return_storage_ptr__;
}

Assistant:

inline Path operator/( const Path& lhs_, const Path& rhs_ )
    {
        if( 0 == lhs_.m_string.length() )
        {
            return rhs_;
        }
        if( 0 == rhs_.m_string.length() )
        {
            return lhs_;
        }
        std::string strlhs = lhs_.m_string;
        while( strlhs.length() && strlhs.find_last_of( FILESYSTEMUTILS_SEPERATORS ) == strlhs.length()-1 )
        {
        	strlhs.erase(strlhs.length()-1, 1);
        }
        
        //note: should probably remove preceding seperators to rhs_, but this has not as yet occured
        Path join = strlhs + Path::seperator + rhs_.m_string;
        return join;
    }